

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::CreateStream
          (HLSL2GLSLConverterImpl *this,Char *InputFileName,
          IShaderSourceInputStreamFactory *pSourceStreamFactory,Char *HLSLSource,size_t NumSymbols,
          IHLSL2GLSLConversionStream **ppStream)

{
  ConversionStream *pCVar1;
  bool local_59;
  size_t local_58;
  Char *local_50;
  IShaderSourceInputStreamFactory *local_48;
  Char *local_40;
  IMemoryAllocator *local_38;
  undefined8 local_30;
  char *local_28;
  char *local_20;
  undefined4 local_18;
  
  local_58 = NumSymbols;
  local_50 = HLSLSource;
  local_48 = pSourceStreamFactory;
  local_40 = InputFileName;
  local_38 = GetRawAllocator();
  local_30 = 0;
  local_28 = "HLSL2GLSLConverterImpl::ConversionStream object instance";
  local_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
  ;
  local_18 = 0x11a3;
  local_59 = true;
  pCVar1 = MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>
           ::operator()((MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>
                         *)&local_38,this,&local_40,&local_48,&local_50,&local_58,&local_59);
  (**(pCVar1->super_ObjectBase<Diligent::IHLSL2GLSLConversionStream>).
     super_RefCountedObject<Diligent::IHLSL2GLSLConversionStream>.super_IHLSL2GLSLConversionStream.
     super_IObject._vptr_IObject)(pCVar1,IID_HLSL2GLSLConversionStream,ppStream);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::CreateStream(const Char*                      InputFileName,
                                          IShaderSourceInputStreamFactory* pSourceStreamFactory,
                                          const Char*                      HLSLSource,
                                          size_t                           NumSymbols,
                                          IHLSL2GLSLConversionStream**     ppStream) const
{
    try
    {
        auto* pStream = NEW_RC_OBJ(GetRawAllocator(), "HLSL2GLSLConverterImpl::ConversionStream object instance", ConversionStream)(*this, InputFileName, pSourceStreamFactory, HLSLSource, NumSymbols, true);
        pStream->QueryInterface(IID_HLSL2GLSLConversionStream, reinterpret_cast<IObject**>(ppStream));
    }
    catch (std::runtime_error&)
    {
        *ppStream = nullptr;
    }
}